

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cali.cpp
# Opt level: O0

void cali_unpack_snapshot(uchar *buf,size_t *bytes_read,cali_entry_proc_fn proc_fn,void *user_arg)

{
  UnpackEntryOp fn;
  CompressedSnapshotRecordView local_88;
  undefined1 local_60 [8];
  Caliper c;
  UnpackEntryOp op;
  size_t pos;
  void *user_arg_local;
  cali_entry_proc_fn proc_fn_local;
  size_t *bytes_read_local;
  uchar *buf_local;
  
  op.m_fn = (cali_entry_proc_fn)0x0;
  anon_unknown.dwarf_3c2cdc::UnpackEntryOp::UnpackEntryOp
            ((UnpackEntryOp *)&c.m_is_signal,proc_fn,user_arg);
  cali::Caliper::Caliper((Caliper *)local_60);
  cali::CompressedSnapshotRecordView::CompressedSnapshotRecordView(&local_88,buf,(size_t *)&op.m_fn)
  ;
  fn.m_fn = (cali_entry_proc_fn)op.m_arg;
  fn.m_arg = (void *)c._24_8_;
  cali::CompressedSnapshotRecordView::unpack<(anonymous_namespace)::UnpackEntryOp>
            (&local_88,(CaliperMetadataAccessInterface *)local_60,fn);
  cali::CompressedSnapshotRecordView::~CompressedSnapshotRecordView(&local_88);
  if (bytes_read != (size_t *)0x0) {
    *bytes_read = (size_t)(op.m_fn + *bytes_read);
  }
  cali::Caliper::~Caliper((Caliper *)local_60);
  return;
}

Assistant:

void cali_unpack_snapshot(const unsigned char* buf, size_t* bytes_read, cali_entry_proc_fn proc_fn, void* user_arg)
{
    size_t          pos = 0;
    ::UnpackEntryOp op(proc_fn, user_arg);

    // FIXME: Need sigsafe instance? Only does read-only
    // node-by-id lookup though, so we should be safe
    Caliper c;

    CompressedSnapshotRecordView(buf, &pos).unpack(&c, op);

    if (bytes_read)
        *bytes_read += pos;
}